

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,half2 *value)

{
  bool bVar1;
  half hVar2;
  _Type in_RAX;
  float2 v;
  array<float,_2UL> local_18;
  
  local_18._M_elems = in_RAX;
  bVar1 = ParseBasicTypeTuple<float,2ul>(this,&local_18);
  if (bVar1) {
    hVar2 = tinyusdz::value::float_to_half_full(local_18._M_elems[0]);
    value->_M_elems[0].value = hVar2.value;
    hVar2 = tinyusdz::value::float_to_half_full(local_18._M_elems[1]);
    value->_M_elems[1].value = hVar2.value;
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(value::half2 *value) {
  // Parse as float
  value::float2 v;
  if (!ReadBasicType(&v)) {
    return false;
  }

  (*value)[0] = value::float_to_half_full(v[0]);
  (*value)[1] = value::float_to_half_full(v[1]);
  return true;
}